

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImGuiContext::ImGuiContext(ImGuiContext *this,ImFontAtlas *shared_font_atlas)

{
  long lVar1;
  ImGuiKeyChord IVar2;
  bool bVar3;
  
  ImGuiIO::ImGuiIO(&this->IO);
  ImGuiStyle::ImGuiStyle(&this->Style);
  ImDrawListSharedData::ImDrawListSharedData(&this->DrawListSharedData);
  (this->WindowsHoverPadding).x = 0.0;
  (this->WindowsHoverPadding).y = 0.0;
  (this->WheelingWindowRefMousePos).x = 0.0;
  (this->WheelingWindowRefMousePos).y = 0.0;
  (this->ActiveIdClickOffset).x = 0.0;
  (this->ActiveIdClickOffset).y = 0.0;
  (this->KeysMayBeCharInput).Storage[0] = 0;
  (this->KeysMayBeCharInput).Storage[1] = 0;
  (this->KeysMayBeCharInput).Storage[2] = 0;
  (this->KeysMayBeCharInput).Storage[3] = 0;
  (this->KeysMayBeCharInput).Storage[4] = 0;
  (this->InputEventsQueue).Size = 0;
  (this->InputEventsQueue).Capacity = 0;
  (this->InputEventsQueue).Data = (ImGuiInputEvent *)0x0;
  (this->InputEventsTrail).Size = 0;
  (this->InputEventsTrail).Capacity = 0;
  (this->InputEventsTrail).Data = (ImGuiInputEvent *)0x0;
  (this->Windows).Size = 0;
  (this->Windows).Capacity = 0;
  (this->Windows).Data = (ImGuiWindow **)0x0;
  (this->WindowsFocusOrder).Size = 0;
  (this->WindowsFocusOrder).Capacity = 0;
  (this->WindowsFocusOrder).Data = (ImGuiWindow **)0x0;
  (this->WindowsTempSortBuffer).Size = 0;
  (this->WindowsTempSortBuffer).Capacity = 0;
  (this->WindowsTempSortBuffer).Data = (ImGuiWindow **)0x0;
  (this->CurrentWindowStack).Size = 0;
  (this->CurrentWindowStack).Capacity = 0;
  (this->CurrentWindowStack).Data = (ImGuiWindowStackData *)0x0;
  (this->WindowsById).Data.Size = 0;
  (this->WindowsById).Data.Capacity = 0;
  (this->WindowsById).Data.Data = (ImGuiStoragePair *)0x0;
  (this->WheelingWindowWheelRemainder).x = 0.0;
  (this->WheelingWindowWheelRemainder).y = 0.0;
  (this->WheelingAxisAvg).x = 0.0;
  (this->WheelingAxisAvg).y = 0.0;
  lVar1 = 0x415d;
  do {
    *(undefined8 *)((long)this + lVar1 + -9) = 0xffffffffffffffff;
    *(undefined2 *)((long)this + lVar1 + -1) = 0;
    lVar1 = lVar1 + 0xc;
  } while (lVar1 != 0x4895);
  ImGuiKeyRoutingTable::ImGuiKeyRoutingTable(&this->KeysRoutingTable);
  (this->NextItemData).SelectionUserData = 0;
  (this->NextItemData).Width = 0.0;
  (this->NextItemData).Shortcut = 0;
  (this->NextItemData).ShortcutFlags = 0;
  (this->NextItemData).OpenVal = false;
  (this->NextItemData).OpenCond = '\0';
  (this->NextItemData).RefVal.Data[0] = '\0';
  (this->NextItemData).RefVal.Data[1] = '\0';
  *(undefined8 *)((this->NextItemData).RefVal.Data + 2) = 0;
  (this->NextItemData).Flags = 0;
  (this->NextItemData).ItemFlags = 0;
  *(undefined8 *)&(this->NextItemData).FocusScopeId = 0;
  *(undefined8 *)&(this->NextItemData).StorageId = 0;
  (this->NextItemData).SelectionUserData = -1;
  (this->NavFocusRoute).Size = 0;
  (this->NavFocusRoute).Capacity = 0;
  (this->NavFocusRoute).Data = (ImGuiFocusScopeData *)0x0;
  (this->NavInitResult).Window = (ImGuiWindow *)0x0;
  (this->NavInitResult).ID = 0;
  (this->NavInitResult).FocusScopeId = 0;
  (this->NavInitResult).RectRel.Min.x = 0.0;
  (this->NavInitResult).RectRel.Min.y = 0.0;
  (this->NavInitResult).RectRel.Max.x = 0.0;
  (this->NavInitResult).RectRel.Max.y = 0.0;
  (this->NavInitResult).InFlags = 0;
  memset(&this->LastItemData,0,0xc0);
  memset(&this->ColorStack,0,0xa0);
  (this->NavInitResult).SelectionUserData = -1;
  (this->NavInitResult).DistAxial = 3.4028235e+38;
  (this->NavInitResult).DistBox = 3.4028235e+38;
  (this->NavInitResult).DistCenter = 3.4028235e+38;
  (this->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (this->NavMoveResultLocal).ID = 0;
  (this->NavMoveResultLocal).FocusScopeId = 0;
  (this->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (this->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (this->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (this->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (this->NavMoveResultLocal).InFlags = 0;
  (this->NavScoringRect).Min.x = 0.0;
  (this->NavScoringRect).Min.y = 0.0;
  (this->NavScoringRect).Max.x = 0.0;
  (this->NavScoringRect).Max.y = 0.0;
  (this->NavScoringNoClipRect).Min.x = 0.0;
  (this->NavScoringNoClipRect).Min.y = 0.0;
  (this->NavScoringNoClipRect).Max.x = 0.0;
  (this->NavScoringNoClipRect).Max.y = 0.0;
  (this->NavMoveResultLocal).SelectionUserData = -1;
  (this->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (this->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (this->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (this->NavMoveResultLocalVisible).Window = (ImGuiWindow *)0x0;
  (this->NavMoveResultLocalVisible).ID = 0;
  (this->NavMoveResultLocalVisible).FocusScopeId = 0;
  (this->NavMoveResultLocalVisible).RectRel.Min.x = 0.0;
  (this->NavMoveResultLocalVisible).RectRel.Min.y = 0.0;
  (this->NavMoveResultLocalVisible).RectRel.Max.x = 0.0;
  (this->NavMoveResultLocalVisible).RectRel.Max.y = 0.0;
  (this->NavMoveResultLocalVisible).InFlags = 0;
  (this->NavMoveResultLocalVisible).SelectionUserData = -1;
  (this->NavMoveResultLocalVisible).DistAxial = 3.4028235e+38;
  (this->NavMoveResultLocalVisible).DistBox = 3.4028235e+38;
  (this->NavMoveResultLocalVisible).DistCenter = 3.4028235e+38;
  (this->NavMoveResultOther).InFlags = 0;
  (this->NavMoveResultOther).RectRel.Min.x = 0.0;
  (this->NavMoveResultOther).RectRel.Min.y = 0.0;
  (this->NavMoveResultOther).RectRel.Max.x = 0.0;
  (this->NavMoveResultOther).RectRel.Max.y = 0.0;
  (this->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (this->NavMoveResultOther).ID = 0;
  (this->NavMoveResultOther).FocusScopeId = 0;
  (this->NavMoveResultOther).SelectionUserData = -1;
  (this->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (this->NavMoveResultOther).DistBox = 3.4028235e+38;
  (this->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (this->NavTabbingResultFirst).Window = (ImGuiWindow *)0x0;
  (this->NavTabbingResultFirst).ID = 0;
  (this->NavTabbingResultFirst).FocusScopeId = 0;
  (this->NavTabbingResultFirst).RectRel.Min.x = 0.0;
  (this->NavTabbingResultFirst).RectRel.Min.y = 0.0;
  (this->NavTabbingResultFirst).RectRel.Max.x = 0.0;
  (this->NavTabbingResultFirst).RectRel.Max.y = 0.0;
  (this->NavTabbingResultFirst).InFlags = 0;
  (this->NavTabbingResultFirst).SelectionUserData = -1;
  (this->NavTabbingResultFirst).DistAxial = 3.4028235e+38;
  (this->NavTabbingResultFirst).DistBox = 3.4028235e+38;
  (this->NavTabbingResultFirst).DistCenter = 3.4028235e+38;
  (this->DragDropPayload).DataType[0] = '\0';
  (this->DragDropPayload).DataType[1] = '\0';
  (this->DragDropPayload).DataType[2] = '\0';
  (this->DragDropPayload).DataType[3] = '\0';
  (this->DragDropPayload).DataType[4] = '\0';
  (this->DragDropPayload).DataType[5] = '\0';
  (this->DragDropPayload).DataType[6] = '\0';
  (this->DragDropPayload).DataType[7] = '\0';
  (this->DragDropPayload).DataType[8] = '\0';
  (this->DragDropPayload).DataType[9] = '\0';
  (this->DragDropPayload).DataType[10] = '\0';
  (this->DragDropPayload).DataType[0xb] = '\0';
  (this->DragDropPayload).DataType[0xc] = '\0';
  (this->DragDropPayload).DataType[0xd] = '\0';
  (this->DragDropPayload).DataType[0xe] = '\0';
  (this->DragDropPayload).DataType[0xf] = '\0';
  (this->DragDropPayload).DataType[0x10] = '\0';
  (this->DragDropPayload).DataType[0x11] = '\0';
  (this->DragDropPayload).DataType[0x12] = '\0';
  (this->DragDropPayload).DataType[0x13] = '\0';
  (this->DragDropPayload).DataType[0x14] = '\0';
  (this->DragDropPayload).DataType[0x15] = '\0';
  (this->DragDropPayload).DataType[0x16] = '\0';
  (this->DragDropPayload).DataType[0x17] = '\0';
  (this->DragDropPayload).DataType[0x18] = '\0';
  (this->DragDropPayload).DataType[0x19] = '\0';
  (this->DragDropPayload).DataType[0x1a] = '\0';
  (this->DragDropPayload).DataType[0x1b] = '\0';
  (this->DragDropPayload).DataType[0x1c] = '\0';
  (this->DragDropPayload).DataType[0x1d] = '\0';
  (this->DragDropPayload).DataType[0x1e] = '\0';
  (this->DragDropPayload).DataType[0x1f] = '\0';
  *(undefined2 *)((this->DragDropPayload).DataType + 0x20) = 0;
  (this->DragDropPayload).Data = (void *)0x0;
  (this->DragDropPayload).DataSize = 0;
  (this->DragDropPayload).SourceId = 0;
  (this->DragDropPayload).SourceParentId = 0;
  (this->DragDropPayload).DataFrameCount = -1;
  (this->NavWindowingAccumDeltaPos).x = 0.0;
  (this->NavWindowingAccumDeltaPos).y = 0.0;
  (this->NavWindowingAccumDeltaSize).x = 0.0;
  (this->NavWindowingAccumDeltaSize).y = 0.0;
  (this->DragDropPayload).Delivery = false;
  (this->DragDropPayloadBufHeap).Size = 0;
  (this->DragDropPayloadBufHeap).Capacity = 0;
  (this->DragDropPayloadBufHeap).Data = (uchar *)0x0;
  (this->ClipperTempData).Size = 0;
  (this->ClipperTempData).Capacity = 0;
  (this->ClipperTempData).Data = (ImGuiListClipperData *)0x0;
  (this->DragDropTargetClipRect).Min.x = 0.0;
  (this->DragDropTargetClipRect).Min.y = 0.0;
  (this->DragDropTargetClipRect).Max.x = 0.0;
  (this->DragDropTargetClipRect).Max.y = 0.0;
  (this->DragDropTargetRect).Min.x = 0.0;
  (this->DragDropTargetRect).Min.y = 0.0;
  (this->DragDropTargetRect).Max.x = 0.0;
  (this->DragDropTargetRect).Max.y = 0.0;
  (this->DrawChannelsTempMergeBuffer).Data = (ImDrawChannel *)0x0;
  (this->TablesLastTimeActive).Data = (float *)0x0;
  (this->DrawChannelsTempMergeBuffer).Size = 0;
  (this->DrawChannelsTempMergeBuffer).Capacity = 0;
  (this->Tables).FreeIdx = 0;
  (this->Tables).AliveCount = 0;
  (this->TablesLastTimeActive).Size = 0;
  (this->TablesLastTimeActive).Capacity = 0;
  (this->Tables).Map.Data.Size = 0;
  (this->Tables).Map.Data.Capacity = 0;
  (this->Tables).Map.Data.Data = (ImGuiStoragePair *)0x0;
  (this->Tables).Buf.Size = 0;
  (this->Tables).Buf.Capacity = 0;
  (this->Tables).Buf.Data = (ImGuiTable *)0x0;
  (this->TablesTempData).Size = 0;
  (this->TablesTempData).Capacity = 0;
  (this->TablesTempData).Data = (ImGuiTableTempData *)0x0;
  memset(&this->TabBars,0,0xb0);
  (this->MultiSelectTempData).Size = 0;
  (this->MultiSelectTempData).Capacity = 0;
  (this->MultiSelectTempData).Data = (ImGuiMultiSelectTempData *)0x0;
  (this->MultiSelectStorage).Buf.Size = 0;
  (this->MultiSelectStorage).Buf.Capacity = 0;
  (this->MultiSelectStorage).Buf.Data = (ImGuiMultiSelectState *)0x0;
  (this->MultiSelectStorage).Map.Data.Size = 0;
  (this->MultiSelectStorage).Map.Data.Capacity = 0;
  (this->MultiSelectStorage).Map.Data.Data = (ImGuiStoragePair *)0x0;
  (this->MultiSelectStorage).FreeIdx = 0;
  (this->MultiSelectStorage).AliveCount = 0;
  memset(&this->MouseLastValidPos,0,0xeb8);
  ImFont::ImFont(&this->InputTextPasswordFont);
  (this->LogBuffer).Buf.Size = 0;
  (this->LogBuffer).Buf.Capacity = 0;
  (this->LogBuffer).Buf.Data = (char *)0x0;
  (this->ColorPickerRef).x = 0.0;
  (this->ColorPickerRef).y = 0.0;
  (this->ColorPickerRef).z = 0.0;
  (this->ColorPickerRef).w = 0.0;
  (this->ComboPreviewData).PreviewRect.Min.x = 0.0;
  (this->ComboPreviewData).PreviewRect.Min.y = 0.0;
  (this->ComboPreviewData).PreviewRect.Max.x = 0.0;
  (this->ComboPreviewData).PreviewRect.Max.y = 0.0;
  (this->ComboPreviewData).BackupCursorPos.x = 0.0;
  (this->ComboPreviewData).BackupCursorPos.y = 0.0;
  (this->ComboPreviewData).BackupCursorMaxPos.x = 0.0;
  (this->ComboPreviewData).BackupCursorMaxPos.y = 0.0;
  (this->ComboPreviewData).BackupCursorPosPrevLine.x = 0.0;
  (this->ComboPreviewData).BackupCursorPosPrevLine.y = 0.0;
  (this->ComboPreviewData).BackupPrevLineTextBaseOffset = 0.0;
  (this->ComboPreviewData).BackupLayout = 0;
  (this->WindowResizeBorderExpectedRect).Min.x = 0.0;
  (this->WindowResizeBorderExpectedRect).Min.y = 0.0;
  (this->WindowResizeBorderExpectedRect).Max.x = 0.0;
  (this->WindowResizeBorderExpectedRect).Max.y = 0.0;
  memset(&this->ClipboardHandlerData,0,0xa8);
  (this->SettingsIniData).Buf.Size = 0;
  (this->SettingsIniData).Buf.Capacity = 0;
  (this->SettingsIniData).Buf.Data = (char *)0x0;
  (this->SettingsHandlers).Size = 0;
  (this->SettingsHandlers).Capacity = 0;
  (this->SettingsHandlers).Data = (ImGuiSettingsHandler *)0x0;
  (this->SettingsWindows).Buf.Size = 0;
  (this->SettingsWindows).Buf.Capacity = 0;
  (this->SettingsWindows).Buf.Data = (char *)0x0;
  (this->SettingsTables).Buf.Size = 0;
  (this->SettingsTables).Buf.Capacity = 0;
  (this->SettingsTables).Buf.Data = (char *)0x0;
  (this->Hooks).Size = 0;
  (this->Hooks).Capacity = 0;
  (this->Hooks).Data = (ImGuiContextHook *)0x0;
  (this->DebugLogBuf).Buf.Size = 0;
  (this->DebugLogBuf).Buf.Capacity = 0;
  (this->DebugLogBuf).Buf.Data = (char *)0x0;
  (this->DebugLogIndex).LineOffsets.Size = 0;
  (this->DebugLogIndex).LineOffsets.Capacity = 0;
  (this->DebugLogIndex).LineOffsets.Data = (int *)0x0;
  (this->DebugLogIndex).EndOffset = 0;
  (this->DebugFlashStyleColorBackup).x = 0.0;
  (this->DebugFlashStyleColorBackup).y = 0.0;
  (this->DebugFlashStyleColorBackup).z = 0.0;
  (this->DebugFlashStyleColorBackup).w = 0.0;
  *(undefined8 *)((long)&(this->DebugFlashStyleColorBackup).w + 1) = 0;
  (this->DebugMetricsConfig).ShowDrawCmdMesh = true;
  (this->DebugMetricsConfig).ShowDrawCmdBoundingBoxes = true;
  (this->DebugMetricsConfig).ShowTextEncodingViewer = false;
  (this->DebugMetricsConfig).ShowAtlasTintedWithTextColor = false;
  (this->DebugMetricsConfig).ShowWindowsRectsType = -1;
  (this->DebugMetricsConfig).ShowTablesRectsType = -1;
  (this->DebugMetricsConfig).HighlightMonitorIdx = -1;
  (this->DebugMetricsConfig).HighlightViewportID = 0;
  (this->DebugIDStackTool).CopyToClipboardOnCtrlC = false;
  *(undefined3 *)&(this->DebugIDStackTool).field_0x21 = 0;
  (this->DebugIDStackTool).CopyToClipboardLastTime = 0.0;
  (this->DebugIDStackTool).LastActiveFrame = 0;
  (this->DebugIDStackTool).StackLevel = 0;
  *(undefined8 *)&(this->DebugIDStackTool).QueryId = 0;
  (this->DebugIDStackTool).Results.Size = 0;
  (this->DebugIDStackTool).Results.Capacity = 0;
  (this->DebugIDStackTool).Results.Data = (ImGuiStackLevelInfo *)0x0;
  (this->DebugIDStackTool).CopyToClipboardLastTime = -3.4028235e+38;
  (this->DebugAllocInfo).LastEntriesBuf[4].FrameCount = 0;
  (this->DebugAllocInfo).LastEntriesBuf[4].AllocCount = 0;
  (this->DebugAllocInfo).LastEntriesBuf[4].FreeCount = 0;
  (this->DebugAllocInfo).LastEntriesBuf[5].FrameCount = 0;
  (this->DebugAllocInfo).LastEntriesBuf[5].AllocCount = 0;
  (this->DebugAllocInfo).LastEntriesBuf[5].FreeCount = 0;
  *(undefined8 *)&(this->DebugAllocInfo).LastEntriesBuf[2].AllocCount = 0;
  *(undefined8 *)&(this->DebugAllocInfo).LastEntriesBuf[3].AllocCount = 0;
  *(undefined8 *)&(this->DebugAllocInfo).LastEntriesBuf[0].AllocCount = 0;
  *(undefined8 *)&(this->DebugAllocInfo).LastEntriesBuf[1].AllocCount = 0;
  (this->DebugAllocInfo).TotalAllocCount = 0;
  (this->DebugAllocInfo).TotalFreeCount = 0;
  (this->DebugAllocInfo).LastEntriesIdx = 0;
  *(undefined2 *)&(this->DebugAllocInfo).field_0xa = 0;
  (this->DebugAllocInfo).LastEntriesBuf[0].FrameCount = 0;
  (this->TempBuffer).Size = 0;
  (this->TempBuffer).Capacity = 0;
  (this->TempBuffer).Data = (char *)0x0;
  (this->IO).Ctx = this;
  (this->InputTextState).Ctx = this;
  this->Initialized = false;
  this->FontAtlasOwnedByContext = shared_font_atlas == (ImFontAtlas *)0x0;
  this->Font = (ImFont *)0x0;
  this->FontSize = 0.0;
  this->FontBaseSize = 0.0;
  this->FontScale = 0.0;
  this->CurrentDpiScale = 0.0;
  if (shared_font_atlas == (ImFontAtlas *)0x0) {
    shared_font_atlas = (ImFontAtlas *)ImGui::MemAlloc(0x4a0);
    ImFontAtlas::ImFontAtlas(shared_font_atlas);
  }
  (this->IO).Fonts = shared_font_atlas;
  this->Time = 0.0;
  this->FrameCount = 0;
  this->FrameCountEnded = -1;
  this->FrameCountRendered = -1;
  this->WithinFrameScope = false;
  this->WithinFrameScopeWithImplicitWindow = false;
  this->WithinEndChild = false;
  this->GcCompactAll = false;
  this->InputEventsNextMouseSource = ImGuiMouseSource_Mouse;
  this->InputEventsNextEventId = 1;
  this->TestEngineHookItems = false;
  this->TestEngine = (void *)0x0;
  this->ContextName[0] = '\0';
  this->ContextName[1] = '\0';
  this->ContextName[2] = '\0';
  this->ContextName[3] = '\0';
  this->ContextName[4] = '\0';
  this->ContextName[5] = '\0';
  this->ContextName[6] = '\0';
  this->ContextName[7] = '\0';
  this->ContextName[8] = '\0';
  this->ContextName[9] = '\0';
  this->ContextName[10] = '\0';
  this->ContextName[0xb] = '\0';
  this->ContextName[0xc] = '\0';
  this->ContextName[0xd] = '\0';
  this->ContextName[0xe] = '\0';
  this->ContextName[0xf] = '\0';
  this->WindowsActiveCount = 0;
  this->CurrentWindow = (ImGuiWindow *)0x0;
  this->HoveredWindow = (ImGuiWindow *)0x0;
  this->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
  this->HoveredWindowBeforeClear = (ImGuiWindow *)0x0;
  this->MovingWindow = (ImGuiWindow *)0x0;
  this->WheelingWindow = (ImGuiWindow *)0x0;
  this->WheelingWindowScrolledFrame = -1;
  this->WheelingWindowReleaseTimer = 0.0;
  this->WheelingWindowStartFrame = -1;
  this->DebugHookIdInfo = 0;
  this->HoveredId = 0;
  this->HoveredIdPreviousFrame = 0;
  this->HoveredIdTimer = 0.0;
  *(undefined8 *)((long)&this->HoveredIdTimer + 3) = 0;
  this->ActiveIdHasBeenPressedBefore = false;
  this->ActiveIdHasBeenEditedBefore = false;
  this->ActiveIdHasBeenEditedThisFrame = false;
  this->ActiveIdFromShortcut = false;
  this->ActiveId = 0;
  this->ActiveIdIsAlive = 0;
  this->ActiveIdTimer = 0.0;
  this->ActiveIdIsJustActivated = false;
  this->ActiveIdAllowOverlap = false;
  this->ActiveIdNoClearOnFocusLoss = false;
  this->ActiveIdHasBeenPressedBefore = false;
  (this->ActiveIdClickOffset).x = -1.0;
  (this->ActiveIdClickOffset).y = -1.0;
  this->ActiveIdWindow = (ImGuiWindow *)0x0;
  this->ActiveIdSource = ImGuiInputSource_None;
  this->ActiveIdPreviousFrame = 0;
  this->field_0x40f7 = 0xff;
  this->ActiveIdPreviousFrameIsAlive = false;
  this->ActiveIdPreviousFrameHasBeenEditedBefore = false;
  this->ActiveIdPreviousFrameWindow = (ImGuiWindow *)0x0;
  this->LastActiveId = 0;
  this->LastActiveIdTimer = 0.0;
  this->LastKeyModsChangeTime = -1.0;
  this->LastKeyModsChangeFromNoneTime = -1.0;
  this->LastKeyboardKeyPressTime = -1.0;
  this->ActiveIdUsingNavDirMask = 0;
  this->ActiveIdUsingAllKeyboardKeys = false;
  this->CurrentFocusScopeId = 0;
  this->CurrentItemFlags = 0;
  this->DebugShowGroupRects = false;
  this->NavWindow = (ImGuiWindow *)0x0;
  this->NavId = 0;
  this->NavFocusScopeId = 0;
  this->NavLayer = ImGuiNavLayer_Main;
  this->NavActivateId = 0;
  this->NavActivateDownId = 0;
  this->NavActivatePressedId = 0;
  this->NavActivateFlags = 0;
  this->NavHighlightActivatedId = 0;
  this->NavHighlightActivatedTimer = 0.0;
  this->NavNextActivateId = 0;
  this->NavNextActivateFlags = 0;
  this->NavInputSource = ImGuiInputSource_Keyboard;
  this->NavLastValidSelectionUserData = -1;
  this->NavIdIsAlive = false;
  this->NavMousePosDirty = false;
  this->NavDisableHighlight = true;
  this->NavMoveSubmitted = false;
  this->NavMoveScoringItems = false;
  this->NavMoveForwardToNextFrame = false;
  this->NavDisableMouseHover = false;
  this->NavAnyRequest = false;
  this->NavInitRequest = false;
  this->NavInitRequestFromMove = false;
  this->NavMoveDirForDebug = ImGuiDir_None;
  this->NavMoveClipDir = ImGuiDir_None;
  this->NavMoveFlags = 0;
  this->NavMoveScrollFlags = 0;
  this->NavMoveKeyMods = 0;
  this->NavMoveDir = ImGuiDir_None;
  this->NavScoringDebugCount = 0;
  this->NavTabbingDir = 0;
  this->NavTabbingCounter = 0;
  this->NavJustMovedToIsTabbing = false;
  this->NavJustMovedToHasSelectionData = false;
  this->NavJustMovedFromFocusScopeId = 0;
  this->NavJustMovedToId = 0;
  this->NavJustMovedToFocusScopeId = 0;
  this->NavJustMovedToKeyMods = 0;
  bVar3 = (this->IO).ConfigMacOSXBehaviors != false;
  IVar2 = 0x1200;
  if (bVar3) {
    IVar2 = 0x8200;
  }
  this->ConfigNavWindowingKeyNext = IVar2;
  IVar2 = 0x3200;
  if (bVar3) {
    IVar2 = 0xa200;
  }
  this->ConfigNavWindowingKeyPrev = IVar2;
  this->NavWindowingToggleKey = ImGuiKey_KeysData_OFFSET;
  this->DragDropSourceFlags = 0;
  this->NavWindowingTarget = (ImGuiWindow *)0x0;
  this->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
  this->NavWindowingListWindow = (ImGuiWindow *)0x0;
  this->NavWindowingTimer = 0.0;
  this->NavWindowingHighlightAlpha = 0.0;
  this->NavWindowingToggleLayer = false;
  *(undefined4 *)((long)&this->DimBgRatio + 3) = 0;
  this->DimBgRatio = 0.0;
  this->DragDropSourceFrameCount = -1;
  this->DragDropMouseButton = -1;
  this->DragDropAcceptIdPrev = 0;
  this->DragDropTargetId = 0;
  this->DragDropAcceptFlags = 0;
  this->DragDropAcceptIdCurrRectSurface = 0.0;
  this->DragDropAcceptIdCurr = 0;
  this->DragDropAcceptFrameCount = -1;
  this->DragDropHoldJustPressedId = 0;
  this->CurrentTable = (ImGuiTable *)0x0;
  this->TablesTempDataStacked = 0;
  this->CurrentTabBar = (ImGuiTabBar *)0x0;
  this->CurrentMultiSelect = (ImGuiMultiSelectTempData *)0x0;
  this->MultiSelectTempDataStacked = 0;
  this->ClipperTempDataStacked = 0;
  this->DragDropPayloadBufLocal[0] = '\0';
  this->DragDropPayloadBufLocal[1] = '\0';
  this->DragDropPayloadBufLocal[2] = '\0';
  this->DragDropPayloadBufLocal[3] = '\0';
  this->DragDropPayloadBufLocal[4] = '\0';
  this->DragDropPayloadBufLocal[5] = '\0';
  this->DragDropPayloadBufLocal[6] = '\0';
  this->DragDropPayloadBufLocal[7] = '\0';
  this->DragDropPayloadBufLocal[8] = '\0';
  this->DragDropPayloadBufLocal[9] = '\0';
  this->DragDropPayloadBufLocal[10] = '\0';
  this->DragDropPayloadBufLocal[0xb] = '\0';
  this->DragDropPayloadBufLocal[0xc] = '\0';
  this->DragDropPayloadBufLocal[0xd] = '\0';
  this->DragDropPayloadBufLocal[0xe] = '\0';
  this->DragDropPayloadBufLocal[0xf] = '\0';
  this->HoverItemUnlockedStationaryId = 0;
  this->HoverWindowUnlockedStationaryId = 0;
  this->MouseCursor = 0;
  this->MouseStationaryTimer = 0.0;
  this->HoverItemDelayId = 0;
  this->HoverItemDelayIdPreviousFrame = 0;
  this->HoverItemDelayTimer = 0.0;
  this->HoverItemDelayClearTimer = 0.0;
  this->BeginComboDepth = 0;
  this->TempInputId = 0;
  (this->DataTypeZeroValue).Data[0] = '\0';
  (this->DataTypeZeroValue).Data[1] = '\0';
  (this->DataTypeZeroValue).Data[2] = '\0';
  (this->DataTypeZeroValue).Data[3] = '\0';
  *(undefined8 *)((this->DataTypeZeroValue).Data + 4) = 0;
  this->ColorEditOptions = 0xa900000;
  this->WindowResizeRelativeMode = false;
  this->ColorEditSavedColor = 0;
  this->ColorEditCurrentID = 0;
  this->ColorEditSavedID = 0;
  this->ColorEditSavedHue = 0.0;
  this->ColorEditSavedSat = 0.0;
  *(undefined8 *)&this->ScrollbarSeekMode = 0;
  *(undefined8 *)((long)&this->SliderGrabClickOffset + 2) = 0;
  this->DragCurrentAccum = 0.0;
  this->DragSpeedDefaultRatio = 0.01;
  (this->PlatformImeData).InputPos.x = 0.0;
  (this->PlatformImeData).InputPos.y = 0.0;
  this->TooltipOverrideCount = 0;
  this->DisabledAlphaBackup = 0.0;
  this->DisabledStackSize = 0;
  this->LockMarkEdited = 0;
  (this->PlatformImeDataPrev).InputPos.x = -1.0;
  (this->PlatformImeDataPrev).InputPos.y = -1.0;
  this->SettingsLoaded = false;
  this->SettingsDirtyTimer = 0.0;
  this->HookIdNext = 0;
  this->LogType = ImGuiLogType_None;
  this->LogFile = (ImFileHandle)0x0;
  *(undefined8 *)((long)this->LocalizationTable + 0x39) = 0;
  *(undefined8 *)((long)this->LocalizationTable + 0x41) = 0;
  this->LocalizationTable[6] = (char *)0x0;
  this->LocalizationTable[7] = (char *)0x0;
  this->LocalizationTable[4] = (char *)0x0;
  this->LocalizationTable[5] = (char *)0x0;
  this->LocalizationTable[2] = (char *)0x0;
  this->LocalizationTable[3] = (char *)0x0;
  this->LocalizationTable[0] = (char *)0x0;
  this->LocalizationTable[1] = (char *)0x0;
  this->LogNextPrefix = (char *)0x0;
  this->LogNextSuffix = (char *)0x0;
  this->LogLinePosY = 3.4028235e+38;
  this->LogLineFirstItem = false;
  this->LogDepthRef = 0;
  this->LogDepthToExpand = 2;
  this->LogDepthToExpandDefault = 2;
  this->DebugLogFlags = 0x100000;
  this->DebugLocateId = 0;
  this->DebugLogAutoDisableFlags = 0;
  this->DebugLogAutoDisableFrames = '\0';
  this->DebugLocateFrames = '\0';
  this->DebugBeginReturnValueCullDepth = -1;
  this->DebugItemPickerActive = false;
  this->DebugItemPickerMouseButton = '\0';
  this->DebugItemPickerBreakId = 0;
  this->DebugFlashStyleColorTime = 0.0;
  this->DebugFlashStyleColorIdx = 0x38;
  this->DebugBreakInWindow = 0;
  this->DebugBreakInTable = 0;
  this->DebugBreakInLocateId = false;
  this->DebugBreakKeyChord = 0x263;
  this->DebugBreakInShortcutRouting = 0;
  memset(this->FramerateSecPerFrame,0,0xfc);
  this->WantTextInputNextFrame = -1;
  this->WantCaptureMouseNextFrame = -1;
  this->WantCaptureKeyboardNextFrame = -1;
  this->TempKeychordName[0] = '\0';
  this->TempKeychordName[1] = '\0';
  this->TempKeychordName[2] = '\0';
  this->TempKeychordName[3] = '\0';
  this->TempKeychordName[4] = '\0';
  this->TempKeychordName[5] = '\0';
  this->TempKeychordName[6] = '\0';
  this->TempKeychordName[7] = '\0';
  this->TempKeychordName[8] = '\0';
  this->TempKeychordName[9] = '\0';
  this->TempKeychordName[10] = '\0';
  this->TempKeychordName[0xb] = '\0';
  this->TempKeychordName[0xc] = '\0';
  this->TempKeychordName[0xd] = '\0';
  this->TempKeychordName[0xe] = '\0';
  this->TempKeychordName[0xf] = '\0';
  this->TempKeychordName[0x10] = '\0';
  this->TempKeychordName[0x11] = '\0';
  this->TempKeychordName[0x12] = '\0';
  this->TempKeychordName[0x13] = '\0';
  this->TempKeychordName[0x14] = '\0';
  this->TempKeychordName[0x15] = '\0';
  this->TempKeychordName[0x16] = '\0';
  this->TempKeychordName[0x17] = '\0';
  this->TempKeychordName[0x18] = '\0';
  this->TempKeychordName[0x19] = '\0';
  this->TempKeychordName[0x1a] = '\0';
  this->TempKeychordName[0x1b] = '\0';
  this->TempKeychordName[0x1c] = '\0';
  this->TempKeychordName[0x1d] = '\0';
  this->TempKeychordName[0x1e] = '\0';
  this->TempKeychordName[0x1f] = '\0';
  this->TempKeychordName[0x20] = '\0';
  this->TempKeychordName[0x21] = '\0';
  this->TempKeychordName[0x22] = '\0';
  this->TempKeychordName[0x23] = '\0';
  this->TempKeychordName[0x24] = '\0';
  this->TempKeychordName[0x25] = '\0';
  this->TempKeychordName[0x26] = '\0';
  this->TempKeychordName[0x27] = '\0';
  this->TempKeychordName[0x28] = '\0';
  this->TempKeychordName[0x29] = '\0';
  this->TempKeychordName[0x2a] = '\0';
  this->TempKeychordName[0x2b] = '\0';
  this->TempKeychordName[0x2c] = '\0';
  this->TempKeychordName[0x2d] = '\0';
  this->TempKeychordName[0x2e] = '\0';
  this->TempKeychordName[0x2f] = '\0';
  this->TempKeychordName[0x30] = '\0';
  this->TempKeychordName[0x31] = '\0';
  this->TempKeychordName[0x32] = '\0';
  this->TempKeychordName[0x33] = '\0';
  this->TempKeychordName[0x34] = '\0';
  this->TempKeychordName[0x35] = '\0';
  this->TempKeychordName[0x36] = '\0';
  this->TempKeychordName[0x37] = '\0';
  this->TempKeychordName[0x38] = '\0';
  this->TempKeychordName[0x39] = '\0';
  this->TempKeychordName[0x3a] = '\0';
  this->TempKeychordName[0x3b] = '\0';
  this->TempKeychordName[0x3c] = '\0';
  this->TempKeychordName[0x3d] = '\0';
  this->TempKeychordName[0x3e] = '\0';
  this->TempKeychordName[0x3f] = '\0';
  return;
}

Assistant:

ImGuiContext(ImFontAtlas* shared_font_atlas)
    {
        IO.Ctx = this;
        InputTextState.Ctx = this;

        Initialized = false;
        FontAtlasOwnedByContext = shared_font_atlas ? false : true;
        Font = NULL;
        FontSize = FontBaseSize = FontScale = CurrentDpiScale = 0.0f;
        IO.Fonts = shared_font_atlas ? shared_font_atlas : IM_NEW(ImFontAtlas)();
        Time = 0.0f;
        FrameCount = 0;
        FrameCountEnded = FrameCountRendered = -1;
        WithinFrameScope = WithinFrameScopeWithImplicitWindow = WithinEndChild = false;
        GcCompactAll = false;
        TestEngineHookItems = false;
        TestEngine = NULL;
        memset(ContextName, 0, sizeof(ContextName));

        InputEventsNextMouseSource = ImGuiMouseSource_Mouse;
        InputEventsNextEventId = 1;

        WindowsActiveCount = 0;
        CurrentWindow = NULL;
        HoveredWindow = NULL;
        HoveredWindowUnderMovingWindow = NULL;
        HoveredWindowBeforeClear = NULL;
        MovingWindow = NULL;
        WheelingWindow = NULL;
        WheelingWindowStartFrame = WheelingWindowScrolledFrame = -1;
        WheelingWindowReleaseTimer = 0.0f;

        DebugHookIdInfo = 0;
        HoveredId = HoveredIdPreviousFrame = 0;
        HoveredIdAllowOverlap = false;
        HoveredIdIsDisabled = false;
        HoveredIdTimer = HoveredIdNotActiveTimer = 0.0f;
        ItemUnclipByLog = false;
        ActiveId = 0;
        ActiveIdIsAlive = 0;
        ActiveIdTimer = 0.0f;
        ActiveIdIsJustActivated = false;
        ActiveIdAllowOverlap = false;
        ActiveIdNoClearOnFocusLoss = false;
        ActiveIdHasBeenPressedBefore = false;
        ActiveIdHasBeenEditedBefore = false;
        ActiveIdHasBeenEditedThisFrame = false;
        ActiveIdFromShortcut = false;
        ActiveIdClickOffset = ImVec2(-1, -1);
        ActiveIdWindow = NULL;
        ActiveIdSource = ImGuiInputSource_None;
        ActiveIdMouseButton = -1;
        ActiveIdPreviousFrame = 0;
        ActiveIdPreviousFrameIsAlive = false;
        ActiveIdPreviousFrameHasBeenEditedBefore = false;
        ActiveIdPreviousFrameWindow = NULL;
        LastActiveId = 0;
        LastActiveIdTimer = 0.0f;

        LastKeyboardKeyPressTime = LastKeyModsChangeTime = LastKeyModsChangeFromNoneTime = -1.0;

        ActiveIdUsingNavDirMask = 0x00;
        ActiveIdUsingAllKeyboardKeys = false;

        CurrentFocusScopeId = 0;
        CurrentItemFlags = ImGuiItemFlags_None;
        DebugShowGroupRects = false;

        NavWindow = NULL;
        NavId = NavFocusScopeId = NavActivateId = NavActivateDownId = NavActivatePressedId = 0;
        NavLayer = ImGuiNavLayer_Main;
        NavNextActivateId = 0;
        NavActivateFlags = NavNextActivateFlags = ImGuiActivateFlags_None;
        NavHighlightActivatedId = 0;
        NavHighlightActivatedTimer = 0.0f;
        NavInputSource = ImGuiInputSource_Keyboard;
        NavLastValidSelectionUserData = ImGuiSelectionUserData_Invalid;
        NavIdIsAlive = false;
        NavMousePosDirty = false;
        NavDisableHighlight = true;
        NavDisableMouseHover = false;

        NavAnyRequest = false;
        NavInitRequest = false;
        NavInitRequestFromMove = false;
        NavMoveSubmitted = false;
        NavMoveScoringItems = false;
        NavMoveForwardToNextFrame = false;
        NavMoveFlags = ImGuiNavMoveFlags_None;
        NavMoveScrollFlags = ImGuiScrollFlags_None;
        NavMoveKeyMods = ImGuiMod_None;
        NavMoveDir = NavMoveDirForDebug = NavMoveClipDir = ImGuiDir_None;
        NavScoringDebugCount = 0;
        NavTabbingDir = 0;
        NavTabbingCounter = 0;

        NavJustMovedFromFocusScopeId = NavJustMovedToId = NavJustMovedToFocusScopeId = 0;
        NavJustMovedToKeyMods = ImGuiMod_None;
        NavJustMovedToIsTabbing = false;
        NavJustMovedToHasSelectionData = false;

        // All platforms use Ctrl+Tab but Ctrl<>Super are swapped on Mac...
        // FIXME: Because this value is stored, it annoyingly interfere with toggling io.ConfigMacOSXBehaviors updating this..
        ConfigNavWindowingKeyNext = IO.ConfigMacOSXBehaviors ? (ImGuiMod_Super | ImGuiKey_Tab) : (ImGuiMod_Ctrl | ImGuiKey_Tab);
        ConfigNavWindowingKeyPrev = IO.ConfigMacOSXBehaviors ? (ImGuiMod_Super | ImGuiMod_Shift | ImGuiKey_Tab) : (ImGuiMod_Ctrl | ImGuiMod_Shift | ImGuiKey_Tab);
        NavWindowingTarget = NavWindowingTargetAnim = NavWindowingListWindow = NULL;
        NavWindowingTimer = NavWindowingHighlightAlpha = 0.0f;
        NavWindowingToggleLayer = false;
        NavWindowingToggleKey = ImGuiKey_None;

        DimBgRatio = 0.0f;

        DragDropActive = DragDropWithinSource = DragDropWithinTarget = false;
        DragDropSourceFlags = ImGuiDragDropFlags_None;
        DragDropSourceFrameCount = -1;
        DragDropMouseButton = -1;
        DragDropTargetId = 0;
        DragDropAcceptFlags = ImGuiDragDropFlags_None;
        DragDropAcceptIdCurrRectSurface = 0.0f;
        DragDropAcceptIdPrev = DragDropAcceptIdCurr = 0;
        DragDropAcceptFrameCount = -1;
        DragDropHoldJustPressedId = 0;
        memset(DragDropPayloadBufLocal, 0, sizeof(DragDropPayloadBufLocal));

        ClipperTempDataStacked = 0;

        CurrentTable = NULL;
        TablesTempDataStacked = 0;
        CurrentTabBar = NULL;
        CurrentMultiSelect = NULL;
        MultiSelectTempDataStacked = 0;

        HoverItemDelayId = HoverItemDelayIdPreviousFrame = HoverItemUnlockedStationaryId = HoverWindowUnlockedStationaryId = 0;
        HoverItemDelayTimer = HoverItemDelayClearTimer = 0.0f;

        MouseCursor = ImGuiMouseCursor_Arrow;
        MouseStationaryTimer = 0.0f;

        TempInputId = 0;
        memset(&DataTypeZeroValue, 0, sizeof(DataTypeZeroValue));
        BeginMenuDepth = BeginComboDepth = 0;
        ColorEditOptions = ImGuiColorEditFlags_DefaultOptions_;
        ColorEditCurrentID = ColorEditSavedID = 0;
        ColorEditSavedHue = ColorEditSavedSat = 0.0f;
        ColorEditSavedColor = 0;
        WindowResizeRelativeMode = false;
        ScrollbarSeekMode = 0;
        ScrollbarClickDeltaToGrabCenter = 0.0f;
        SliderGrabClickOffset = 0.0f;
        SliderCurrentAccum = 0.0f;
        SliderCurrentAccumDirty = false;
        DragCurrentAccumDirty = false;
        DragCurrentAccum = 0.0f;
        DragSpeedDefaultRatio = 1.0f / 100.0f;
        DisabledAlphaBackup = 0.0f;
        DisabledStackSize = 0;
        LockMarkEdited = 0;
        TooltipOverrideCount = 0;

        PlatformImeData.InputPos = ImVec2(0.0f, 0.0f);
        PlatformImeDataPrev.InputPos = ImVec2(-1.0f, -1.0f); // Different to ensure initial submission

        SettingsLoaded = false;
        SettingsDirtyTimer = 0.0f;
        HookIdNext = 0;

        memset(LocalizationTable, 0, sizeof(LocalizationTable));

        LogEnabled = false;
        LogType = ImGuiLogType_None;
        LogNextPrefix = LogNextSuffix = NULL;
        LogFile = NULL;
        LogLinePosY = FLT_MAX;
        LogLineFirstItem = false;
        LogDepthRef = 0;
        LogDepthToExpand = LogDepthToExpandDefault = 2;

        DebugLogFlags = ImGuiDebugLogFlags_OutputToTTY;
        DebugLocateId = 0;
        DebugLogAutoDisableFlags = ImGuiDebugLogFlags_None;
        DebugLogAutoDisableFrames = 0;
        DebugLocateFrames = 0;
        DebugBeginReturnValueCullDepth = -1;
        DebugItemPickerActive = false;
        DebugItemPickerMouseButton = ImGuiMouseButton_Left;
        DebugItemPickerBreakId = 0;
        DebugFlashStyleColorTime = 0.0f;
        DebugFlashStyleColorIdx = ImGuiCol_COUNT;

        // Same as DebugBreakClearData(). Those fields are scattered in their respective subsystem to stay in hot-data locations
        DebugBreakInWindow = 0;
        DebugBreakInTable = 0;
        DebugBreakInLocateId = false;
        DebugBreakKeyChord = ImGuiKey_Pause;
        DebugBreakInShortcutRouting = ImGuiKey_None;

        memset(FramerateSecPerFrame, 0, sizeof(FramerateSecPerFrame));
        FramerateSecPerFrameIdx = FramerateSecPerFrameCount = 0;
        FramerateSecPerFrameAccum = 0.0f;
        WantCaptureMouseNextFrame = WantCaptureKeyboardNextFrame = WantTextInputNextFrame = -1;
        memset(TempKeychordName, 0, sizeof(TempKeychordName));
    }